

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.cpp
# Opt level: O0

bool __thiscall
Dielectric::Scatter(Dielectric *this,Ray *ray_in,hit_record_t *hit_record,Vec3 *attenuation,
                   Ray *ray_out)

{
  bool bVar1;
  Ray *this_00;
  float *in_RCX;
  long in_RDX;
  Ray *in_RSI;
  Vec3 *in_RDI;
  undefined8 *in_R8;
  float fVar2;
  double dVar3;
  Vec3 _scattered;
  float _reflect_prob;
  Vec3 _refracted;
  Vec3 outward_normal;
  float ni_over_nt;
  float cosine;
  float angle;
  Vec3 _reflected;
  Ray *in_stack_fffffffffffffec8;
  Vec3 *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffeec;
  float t;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  float in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined8 local_e4;
  undefined8 local_dc;
  undefined8 local_d4;
  undefined4 local_cc;
  Vec3 *in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff4c;
  undefined4 uVar4;
  float in_stack_ffffffffffffff54;
  Vec3 *in_stack_ffffffffffffff58;
  Vec3 local_a0;
  Vec3 local_94;
  Vec3 local_88;
  Vec3 local_7c;
  Vec3 local_70;
  float local_64;
  float local_60;
  float local_5c;
  Vec3 local_58 [2];
  Vec3 local_40;
  Vec3 local_34;
  undefined8 *local_28;
  float *local_20;
  long local_18;
  Ray *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Ray::GetDirection(in_stack_fffffffffffffec8);
  reflect(in_RDI,(Vec3 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  Vec3::~Vec3(&local_40);
  (**(code **)(**(long **)(in_RDI->e + 2) + 0x10))
            (local_58,*(long **)(in_RDI->e + 2),local_18 + 0xc);
  local_20[2] = local_58[0].e[2];
  *(undefined8 *)local_20 = local_58[0].e._0_8_;
  Vec3::~Vec3(local_58);
  Vec3::Vec3(&local_70);
  Ray::GetDirection(in_stack_fffffffffffffec8);
  fVar2 = dot(&local_7c,(Vec3 *)(local_18 + 0x18));
  local_5c = fVar2;
  Vec3::~Vec3(&local_7c);
  if (fVar2 <= 0.0) {
    local_70.e[2] = *(float *)(local_18 + 0x20);
    local_70.e._0_8_ = *(undefined8 *)(local_18 + 0x18);
    local_64 = 1.0 / in_RDI[1].e[1];
    in_stack_fffffffffffffef4 = -local_5c;
    Ray::GetDirection(in_stack_fffffffffffffec8);
    in_stack_fffffffffffffef0 = Vec3::length((Vec3 *)0x125eb0);
    local_60 = in_stack_fffffffffffffef4 / in_stack_fffffffffffffef0;
    Vec3::~Vec3(&local_a0);
  }
  else {
    Vec3::operator-(&in_stack_fffffffffffffec8->m_origin);
    local_70.e[2] = local_88.e[2];
    local_70.e[0] = local_88.e[0];
    local_70.e[1] = local_88.e[1];
    Vec3::~Vec3(&local_88);
    local_64 = in_RDI[1].e[1];
    in_stack_ffffffffffffff00 = local_5c;
    Ray::GetDirection(in_stack_fffffffffffffec8);
    in_stack_fffffffffffffefc = Vec3::length((Vec3 *)0x125d10);
    local_60 = in_stack_ffffffffffffff00 / in_stack_fffffffffffffefc;
    Vec3::~Vec3(&local_94);
    dVar3 = std::sqrt((double)(ulong)(uint)(1.0 - in_RDI[1].e[1] * in_RDI[1].e[1] *
                                                  (1.0 - local_60 * local_60)));
    in_stack_fffffffffffffef8 = SUB84(dVar3,0);
    local_60 = in_stack_fffffffffffffef8;
  }
  Vec3::Vec3((Vec3 *)&stack0xffffffffffffff54);
  uVar4 = 0x3f800000;
  Ray::GetDirection(in_stack_fffffffffffffec8);
  bVar1 = refract(in_stack_ffffffffffffff58,(Vec3 *)CONCAT44(in_stack_ffffffffffffff54,uVar4),
                  in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
  t = (float)CONCAT13(bVar1,(int3)in_stack_fffffffffffffeec);
  Vec3::~Vec3((Vec3 *)&stack0xffffffffffffff44);
  if (((uint)t & 0x1000000) != 0) {
    schlick((float)((ulong)in_stack_fffffffffffffed0 >> 0x20),SUB84(in_stack_fffffffffffffed0,0));
  }
  drand48();
  Vec3::Vec3(in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->m_origin);
  this_00 = (Ray *)(local_18 + 0xc);
  Ray::GetTime(local_10);
  Ray::Ray((Ray *)CONCAT44(fVar2,in_stack_ffffffffffffff00),
           (Vec3 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
           (Vec3 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),t);
  *local_28 = local_e4;
  local_28[1] = local_dc;
  local_28[2] = local_d4;
  *(undefined4 *)(local_28 + 3) = local_cc;
  Ray::~Ray(this_00);
  Vec3::~Vec3((Vec3 *)&stack0xffffffffffffff38);
  Vec3::~Vec3((Vec3 *)&stack0xffffffffffffff54);
  Vec3::~Vec3(&local_70);
  Vec3::~Vec3(&local_34);
  return true;
}

Assistant:

bool
Dielectric::Scatter(const Ray& ray_in, hit_record_t& hit_record, Vec3& attenuation, Ray& ray_out) const
{
    Vec3 _reflected = reflect(ray_in.GetDirection(), hit_record.m_normal);
    attenuation     = m_albedo->GetValue(hit_record.m_u, hit_record.m_v, hit_record.m_point);
    
    float angle;
    float cosine;
    float ni_over_nt;
    Vec3  outward_normal;
    
    if ((angle = dot(ray_in.GetDirection(), hit_record.m_normal)) > 0.0f) {
        outward_normal = -hit_record.m_normal;
        ni_over_nt     = m_ref_idx;
        cosine = angle / ray_in.GetDirection().length(); // cosine *= m_ref_idx;
        cosine = sqrt(1.0f - m_ref_idx*m_ref_idx*(1.0f - cosine*cosine));
    }
    else {
        outward_normal = hit_record.m_normal;
        ni_over_nt     = 1.0f / m_ref_idx;
        cosine         = -angle / ray_in.GetDirection().length();
    }

    Vec3  _refracted;
    float _reflect_prob = 1.0f;
    if (refract(ray_in.GetDirection(), outward_normal, ni_over_nt, _refracted)) {
        _reflect_prob = schlick(cosine, m_ref_idx);
    }

    Vec3  _scattered = (RANDOM_GEN() < _reflect_prob) ? _reflected : _refracted;
    ray_out          = Ray(hit_record.m_point, _scattered, ray_in.GetTime());
    
    return true;
}